

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void __thiscall
leveldb::FindFileTest_OverlapSequenceChecks_Test::TestBody
          (FindFileTest_OverlapSequenceChecks_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  int line;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50 [8];
  undefined8 *local_48;
  AssertHelper local_40;
  string local_38;
  
  FindFileTest::Add(&this->super_FindFileTest,"200","200",5000,3000);
  bVar2 = FindFileTest::Overlaps(&this->super_FindFileTest,"199","199");
  local_50[0] = (internal)!bVar2;
  local_48 = (undefined8 *)0x0;
  if ((bool)local_50[0]) {
    bVar2 = FindFileTest::Overlaps(&this->super_FindFileTest,"201","300");
    local_50[0] = (internal)!bVar2;
    local_48 = (undefined8 *)0x0;
    if ((bool)local_50[0]) {
      local_50[0] = (internal)FindFileTest::Overlaps(&this->super_FindFileTest,"200","200");
      local_48 = (undefined8 *)0x0;
      if ((bool)local_50[0]) {
        local_50[0] = (internal)FindFileTest::Overlaps(&this->super_FindFileTest,"190","200");
        local_48 = (undefined8 *)0x0;
        if ((bool)local_50[0]) {
          local_50[0] = (internal)FindFileTest::Overlaps(&this->super_FindFileTest,"200","210");
          local_48 = (undefined8 *)0x0;
          if ((bool)local_50[0]) {
            return;
          }
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_50,(AssertionResult *)"Overlaps(\"200\", \"210\")","false",
                     "true",in_R9);
          line = 0x9c;
        }
        else {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_50,(AssertionResult *)"Overlaps(\"190\", \"200\")","false",
                     "true",in_R9);
          line = 0x9b;
        }
      }
      else {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_38,local_50,(AssertionResult *)"Overlaps(\"200\", \"200\")","false","true"
                   ,in_R9);
        line = 0x9a;
      }
    }
    else {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_38,local_50,(AssertionResult *)"!Overlaps(\"201\", \"300\")","false","true",
                 in_R9);
      line = 0x99;
    }
  }
  else {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_50,(AssertionResult *)"!Overlaps(\"199\", \"199\")","false","true",
               in_R9);
    line = 0x98;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
             ,line,local_38._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  return;
}

Assistant:

TEST_F(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}